

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

void dequeue_send_callback_data(SEND_CALLBACK_DATA *send_data)

{
  IOTHUB_MESSAGING_HANDLE pIVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  LOGGER_LOG l;
  IOTHUB_MESSAGING_HANDLE messagingHandle;
  SEND_CALLBACK_DATA *send_data_local;
  
  pIVar1 = send_data->messagingHandle;
  iVar2 = singlylinkedlist_remove_if
                    (pIVar1->send_callback_data,remove_single_send_data_condition_function,send_data
                    );
  if (iVar2 == 0) {
    free(send_data);
    pIVar1->send_queue_size = pIVar1->send_queue_size - 1;
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"dequeue_send_callback_data",0xa5,1,
                "Failed dequeueing send_data, not found in list.");
    }
  }
  return;
}

Assistant:

static void dequeue_send_callback_data(SEND_CALLBACK_DATA* send_data)
{
    IOTHUB_MESSAGING_HANDLE messagingHandle = send_data->messagingHandle;

    if (singlylinkedlist_remove_if(messagingHandle->send_callback_data, remove_single_send_data_condition_function, send_data) != 0)
    {
        LogError("Failed dequeueing send_data, not found in list.");
    }
    else
    {
        free(send_data);
        messagingHandle->send_queue_size--;
    }
}